

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_info_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  uint uVar1;
  void *in_RSI;
  LodePNGInfo *in_RDI;
  uint error_5;
  uint error_4;
  uint error_3;
  uint error_2;
  uint error_1;
  uint error;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint local_4;
  
  lodepng_info_cleanup((LodePNGInfo *)0x1c04d8);
  lodepng_memcpy(in_RDI,in_RSI,0x1a8);
  lodepng_color_mode_init(&in_RDI->color);
  local_4 = lodepng_color_mode_copy
                      ((LodePNGColorMode *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (LodePNGColorMode *)0x1c0511);
  if (((local_4 == 0) &&
      (local_4 = LodePNGText_copy((LodePNGInfo *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                  (LodePNGInfo *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
      local_4 == 0)) &&
     (local_4 = LodePNGIText_copy((LodePNGInfo *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                  (LodePNGInfo *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
     local_4 == 0)) {
    if (*(int *)((long)in_RSI + 0xfc) != 0) {
      in_RDI->iccp_defined = 0;
      uVar1 = lodepng_set_icc((LodePNGInfo *)(ulong)in_stack_ffffffffffffffd8,
                              (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                              ,0);
      if (uVar1 != 0) {
        return uVar1;
      }
      in_stack_ffffffffffffffd8 = 0;
    }
    if (*(int *)((long)in_RSI + 0x88) != 0) {
      in_RDI->exif_defined = 0;
      uVar1 = lodepng_set_exif((LodePNGInfo *)CONCAT44(local_4,in_stack_ffffffffffffffd8),
                               (uchar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ),in_stack_ffffffffffffffcc);
      if (uVar1 != 0) {
        return uVar1;
      }
      in_stack_ffffffffffffffd4 = 0;
    }
    LodePNGUnknownChunks_init(in_RDI);
    local_4 = LodePNGUnknownChunks_copy
                        ((LodePNGInfo *)CONCAT44(local_4,in_stack_ffffffffffffffd8),
                         (LodePNGInfo *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (local_4 == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_info_copy(LodePNGInfo* dest, const LodePNGInfo* source) {
  lodepng_info_cleanup(dest);
  lodepng_memcpy(dest, source, sizeof(LodePNGInfo));
  lodepng_color_mode_init(&dest->color);
  CERROR_TRY_RETURN(lodepng_color_mode_copy(&dest->color, &source->color));

#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  CERROR_TRY_RETURN(LodePNGText_copy(dest, source));
  CERROR_TRY_RETURN(LodePNGIText_copy(dest, source));
  if(source->iccp_defined) {
    dest->iccp_defined = 0; /*the memcpy above set this to 1 while it shouldn't*/
    CERROR_TRY_RETURN(lodepng_set_icc(dest, source->iccp_name, source->iccp_profile, source->iccp_profile_size));
  }
  if(source->exif_defined) {
    dest->exif_defined = 0; /*the memcpy above set this to 1 while it shouldn't*/
    CERROR_TRY_RETURN(lodepng_set_exif(dest, source->exif, source->exif_size));
  }

  LodePNGUnknownChunks_init(dest);
  CERROR_TRY_RETURN(LodePNGUnknownChunks_copy(dest, source));
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  return 0;
}